

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

int vkt::api::anon_unknown_0::calcFloatDiff(float a,float b)

{
  StorageType SVar1;
  uint uVar2;
  size_t *in_RCX;
  uchar *sig;
  uchar *sig_00;
  EVP_PKEY_CTX *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  Float<unsigned_int,_8,_23,_127,_3U> local_34 [2];
  Float<unsigned_int,_8,_23,_127,_3U> local_2c;
  deUint32 bvalue;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  deUint32 avalue;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  int bsign;
  float local_14;
  int asign;
  float b_local;
  float a_local;
  
  local_14 = b;
  asign = (int)a;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_1c,a);
  bsign = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign(&local_1c,in_RSI,sig,in_RCX,in_R8,in_R9);
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_24,(float)asign);
  avalue = tcu::Float<unsigned_int,_8,_23,_127,_3U>::sign
                     (&local_24,in_RSI,sig_00,in_RCX,in_R8,in_R9);
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_2c,(float)asign);
  SVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_2c);
  bvalue = SVar1 & 0x7fffffff;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(local_34,local_14);
  SVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(local_34);
  uVar2 = SVar1 & 0x7fffffff;
  if (bsign == avalue) {
    if (bvalue < uVar2) {
      b_local = (float)(uVar2 - bvalue);
    }
    else {
      b_local = (float)(bvalue - uVar2);
    }
  }
  else {
    b_local = (float)(bvalue + uVar2 + 1);
  }
  return (int)b_local;
}

Assistant:

int calcFloatDiff (float a, float b)
{
	const int			asign	= Float32(a).sign();
	const int			bsign	= Float32(a).sign();

	const deUint32		avalue	= (Float32(a).bits() & ((0x1u << 31u) - 1u));
	const deUint32		bvalue	= (Float32(b).bits() & ((0x1u << 31u) - 1u));

	if (asign != bsign)
		return avalue + bvalue + 1u;
	else if (avalue < bvalue)
		return bvalue - avalue;
	else
		return avalue - bvalue;
}